

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O1

void __thiscall Assimp::ASE::Parser::ParseLV3MapBlock(Parser *this,Texture *map)

{
  string *out;
  byte bVar1;
  char *pcVar2;
  byte *pbVar3;
  bool bVar4;
  int iVar5;
  Logger *pLVar6;
  uint uVar7;
  int iVar8;
  Texture *fOut;
  bool bVar9;
  char *pcVar10;
  string temp;
  string local_210;
  Texture *local_1f0;
  Texture *local_1e8;
  Texture *local_1e0;
  Texture *local_1d8;
  Texture *local_1d0;
  char *local_1c8;
  char local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  local_210._M_string_length = 0;
  local_210.field_2._M_local_buf[0] = '\0';
  out = &map->mMapName;
  local_1d0 = (Texture *)&map->mOffsetU;
  local_1d8 = (Texture *)&map->mOffsetV;
  local_1e0 = (Texture *)&map->mScaleU;
  local_1e8 = (Texture *)&map->mScaleV;
  local_1f0 = (Texture *)&map->mRotation;
  bVar9 = true;
  iVar8 = 0;
LAB_003f828c:
  do {
    pcVar2 = this->filePtr;
    if (*pcVar2 != '*') goto LAB_003f866e;
    this->filePtr = pcVar2 + 1;
    iVar5 = strncmp("MAP_CLASS",pcVar2 + 1,9);
    if (iVar5 == 0) {
      bVar1 = pcVar2[10];
      if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
        pcVar10 = pcVar2 + 0xb;
        if (bVar1 == 0) {
          pcVar10 = pcVar2 + 10;
        }
        this->filePtr = pcVar10;
        local_210._M_string_length = 0;
        *local_210._M_dataplus._M_p = '\0';
        bVar4 = ParseString(this,&local_210,"*MAP_CLASS");
        if (!bVar4) {
          SkipToNextToken(this);
        }
        iVar5 = std::__cxx11::string::compare((char *)&local_210);
        if ((iVar5 != 0) && (iVar5 = std::__cxx11::string::compare((char *)&local_210), iVar5 != 0))
        {
          pLVar6 = DefaultLogger::get();
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter<char[33]>
                    ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_1a8,(char (*) [33])"ASE: Skipping unknown map type: ");
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
          std::__cxx11::stringbuf::str();
          Logger::warn(pLVar6,local_1c8);
          if (local_1c8 != local_1b8) {
            operator_delete(local_1c8);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          bVar9 = false;
        }
        goto LAB_003f828c;
      }
    }
    if (bVar9) {
      pcVar2 = this->filePtr;
      iVar5 = strncmp("BITMAP",pcVar2,6);
      if (iVar5 != 0) goto LAB_003f82da;
      bVar1 = pcVar2[6];
      if ((0x20 < (ulong)bVar1) || ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) == 0))
      goto LAB_003f82da;
      pcVar10 = pcVar2 + 7;
      if (bVar1 == 0) {
        pcVar10 = pcVar2 + 6;
      }
      this->filePtr = pcVar10;
      bVar4 = ParseString(this,out,"*BITMAP");
      if (!bVar4) {
        SkipToNextToken(this);
      }
      iVar5 = std::__cxx11::string::compare((char *)out);
      if (iVar5 == 0) {
        pLVar6 = DefaultLogger::get();
        Logger::warn(pLVar6,"ASE: Skipping invalid map entry");
        std::__cxx11::string::_M_replace
                  ((ulong)out,0,(char *)(map->mMapName)._M_string_length,0x736f2f);
      }
    }
    else {
LAB_003f82da:
      pcVar2 = this->filePtr;
      iVar5 = strncmp("UVW_U_OFFSET",pcVar2,0xc);
      if (iVar5 == 0) {
        bVar1 = pcVar2[0xc];
        if ((0x20 < (ulong)bVar1) || ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) == 0))
        goto LAB_003f82f9;
        fOut = local_1d0;
        pcVar10 = pcVar2 + 0xd;
        if (bVar1 == 0) {
          pcVar10 = pcVar2 + 0xc;
        }
LAB_003f865e:
        this->filePtr = pcVar10;
        ParseLV4MeshFloat(this,&fOut->mTextureBlend);
      }
      else {
LAB_003f82f9:
        pcVar2 = this->filePtr;
        iVar5 = strncmp("UVW_V_OFFSET",pcVar2,0xc);
        if (iVar5 == 0) {
          bVar1 = pcVar2[0xc];
          if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
            fOut = local_1d8;
            pcVar10 = pcVar2 + 0xd;
            if (bVar1 == 0) {
              pcVar10 = pcVar2 + 0xc;
            }
            goto LAB_003f865e;
          }
        }
        pcVar2 = this->filePtr;
        iVar5 = strncmp("UVW_U_TILING",pcVar2,0xc);
        if (iVar5 == 0) {
          bVar1 = pcVar2[0xc];
          if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
            fOut = local_1e0;
            pcVar10 = pcVar2 + 0xd;
            if (bVar1 == 0) {
              pcVar10 = pcVar2 + 0xc;
            }
            goto LAB_003f865e;
          }
        }
        pcVar2 = this->filePtr;
        iVar5 = strncmp("UVW_V_TILING",pcVar2,0xc);
        if (iVar5 == 0) {
          bVar1 = pcVar2[0xc];
          if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
            fOut = local_1e8;
            pcVar10 = pcVar2 + 0xd;
            if (bVar1 == 0) {
              pcVar10 = pcVar2 + 0xc;
            }
            goto LAB_003f865e;
          }
        }
        pcVar2 = this->filePtr;
        iVar5 = strncmp("UVW_ANGLE",pcVar2,9);
        if (iVar5 == 0) {
          bVar1 = pcVar2[9];
          if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
            fOut = local_1f0;
            pcVar10 = pcVar2 + 10;
            if (bVar1 == 0) {
              pcVar10 = pcVar2 + 9;
            }
            goto LAB_003f865e;
          }
        }
        pcVar2 = this->filePtr;
        iVar5 = strncmp("MAP_AMOUNT",pcVar2,10);
        if (iVar5 == 0) {
          bVar1 = pcVar2[10];
          if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
            fOut = map;
            pcVar10 = pcVar2 + 0xb;
            if (bVar1 == 0) {
              pcVar10 = pcVar2 + 10;
            }
            goto LAB_003f865e;
          }
        }
LAB_003f866e:
        pbVar3 = (byte *)this->filePtr;
        bVar1 = *pbVar3;
        uVar7 = (uint)bVar1;
        if (bVar1 == 0x7b) {
          iVar8 = iVar8 + 1;
        }
        else if (bVar1 == 0x7d) {
          iVar8 = iVar8 + -1;
          if (iVar8 == 0) {
            this->filePtr = (char *)(pbVar3 + 1);
            SkipToNextToken(this);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_210._M_dataplus._M_p != &local_210.field_2) {
              operator_delete(local_210._M_dataplus._M_p);
            }
            return;
          }
        }
        else if (uVar7 == 0) {
          LogError(this,"Encountered unexpected EOL while parsing a *MAP_XXXXXX chunk (Level 3)");
        }
        if (((uVar7 < 0xe) && ((0x3401U >> (uVar7 & 0x1f) & 1) != 0)) &&
           (this->bLastWasEndLine == false)) {
          this->iLineNumber = this->iLineNumber + 1;
          this->bLastWasEndLine = true;
        }
        else {
          this->bLastWasEndLine = false;
        }
        this->filePtr = (char *)(pbVar3 + 1);
      }
    }
  } while( true );
}

Assistant:

void Parser::ParseLV3MapBlock(Texture& map)
{
    AI_ASE_PARSER_INIT();

    // ***********************************************************
    // *BITMAP should not be there if *MAP_CLASS is not BITMAP,
    // but we need to expect that case ... if the path is
    // empty the texture won't be used later.
    // ***********************************************************
    bool parsePath = true;
    std::string temp;
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;
            // type of map
            if (TokenMatch(filePtr,"MAP_CLASS" ,9))
            {
                temp.clear();
                if(!ParseString(temp,"*MAP_CLASS"))
                    SkipToNextToken();
                if (temp != "Bitmap" && temp != "Normal Bump")
                {
                    ASSIMP_LOG_WARN_F("ASE: Skipping unknown map type: ", temp);
                    parsePath = false;
                }
                continue;
            }
            // path to the texture
            if (parsePath && TokenMatch(filePtr,"BITMAP" ,6))
            {
                if(!ParseString(map.mMapName,"*BITMAP"))
                    SkipToNextToken();

                if (map.mMapName == "None")
                {
                    // Files with 'None' as map name are produced by
                    // an Maja to ASE exporter which name I forgot ..
                    ASSIMP_LOG_WARN("ASE: Skipping invalid map entry");
                    map.mMapName = "";
                }

                continue;
            }
            // offset on the u axis
            if (TokenMatch(filePtr,"UVW_U_OFFSET" ,12))
            {
                ParseLV4MeshFloat(map.mOffsetU);
                continue;
            }
            // offset on the v axis
            if (TokenMatch(filePtr,"UVW_V_OFFSET" ,12))
            {
                ParseLV4MeshFloat(map.mOffsetV);
                continue;
            }
            // tiling on the u axis
            if (TokenMatch(filePtr,"UVW_U_TILING" ,12))
            {
                ParseLV4MeshFloat(map.mScaleU);
                continue;
            }
            // tiling on the v axis
            if (TokenMatch(filePtr,"UVW_V_TILING" ,12))
            {
                ParseLV4MeshFloat(map.mScaleV);
                continue;
            }
            // rotation around the z-axis
            if (TokenMatch(filePtr,"UVW_ANGLE" ,9))
            {
                ParseLV4MeshFloat(map.mRotation);
                continue;
            }
            // map blending factor
            if (TokenMatch(filePtr,"MAP_AMOUNT" ,10))
            {
                ParseLV4MeshFloat(map.mTextureBlend);
                continue;
            }
        }
        AI_ASE_HANDLE_SECTION("3","*MAP_XXXXXX");
    }
    return;
}